

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O1

void lddmc_refs_mark_task_WRAP(WorkerP *w,Task *__dq_head,TD_lddmc_refs_mark_task *t)

{
  Task *__dq_head_00;
  long lVar1;
  long lVar2;
  Worker *pWVar3;
  lddmc_refs_task_t arg_1;
  ulong uVar4;
  long in_FS_OFFSET;
  
  if (w->end != __dq_head) {
    lVar1 = **(long **)(in_FS_OFFSET + -0x20);
    lVar2 = (*(long **)(in_FS_OFFSET + -0x20))[2];
    __dq_head->f = lddmc_refs_mark_p_par_WRAP;
    __dq_head->thief = (_Worker *)0x1;
    *(long *)__dq_head->d = lVar1;
    *(long *)(__dq_head->d + 8) = lVar2 - lVar1 >> 3;
    pWVar3 = w->_public;
    if (w->allstolen == '\0') {
      if (pWVar3->movesplit != '\0') {
        lddmc_refs_mark_task_CALL_cold_1();
      }
    }
    else {
      if (pWVar3->movesplit != '\0') {
        pWVar3->movesplit = '\0';
      }
      uVar4 = (long)__dq_head - (long)w->dq;
      LOCK();
      (pWVar3->ts).v =
           (uVar4 >> 6 & 0xffffffff | (uVar4 & 0xffffffffffffffc0) << 0x1a) + 0x100000000;
      UNLOCK();
      pWVar3->allstolen = '\0';
      w->split = __dq_head + 1;
      w->allstolen = '\0';
    }
    __dq_head_00 = __dq_head + 1;
    if (w->end != __dq_head_00) {
      lVar1 = *(long *)(*(long *)(in_FS_OFFSET + -0x20) + 0x18);
      lVar2 = *(long *)(*(long *)(in_FS_OFFSET + -0x20) + 0x28);
      __dq_head[1].f = lddmc_refs_mark_r_par_WRAP;
      __dq_head[1].thief = (_Worker *)0x1;
      *(long *)__dq_head[1].d = lVar1;
      *(long *)(__dq_head[1].d + 8) = lVar2 - lVar1 >> 3;
      pWVar3 = w->_public;
      if (w->allstolen == '\0') {
        if (pWVar3->movesplit != '\0') {
          lddmc_refs_mark_task_CALL_cold_2();
        }
      }
      else {
        if (pWVar3->movesplit != '\0') {
          pWVar3->movesplit = '\0';
        }
        uVar4 = (long)__dq_head_00 - (long)w->dq;
        LOCK();
        (pWVar3->ts).v =
             (uVar4 >> 6 & 0xffffffff | (uVar4 & 0xffffffffffffffc0) << 0x1a) + 0x100000000;
        UNLOCK();
        pWVar3->allstolen = '\0';
        w->split = __dq_head + 2;
        w->allstolen = '\0';
      }
      arg_1 = *(lddmc_refs_task_t *)(*(long *)(in_FS_OFFSET + -0x20) + 0x30);
      lddmc_refs_mark_s_par_CALL
                (w,__dq_head + 2,arg_1,
                 *(long *)(*(long *)(in_FS_OFFSET + -0x20) + 0x40) - (long)arg_1 >> 4);
      if ((w->_public->movesplit == '\0') && (w->split <= __dq_head_00)) {
        __dq_head[1].thief = (_Worker *)0x0;
        lddmc_refs_mark_r_par_CALL
                  (w,__dq_head_00,*(MDD **)__dq_head[1].d,*(size_t *)(__dq_head[1].d + 8));
      }
      else {
        lddmc_refs_mark_r_par_SYNC_SLOW(w,__dq_head_00);
      }
      if ((w->_public->movesplit == '\0') && (w->split <= __dq_head)) {
        __dq_head->thief = (_Worker *)0x0;
        lddmc_refs_mark_p_par_CALL(w,__dq_head,*(MDD ***)__dq_head->d,*(size_t *)(__dq_head->d + 8))
        ;
        return;
      }
      lddmc_refs_mark_p_par_SYNC_SLOW(w,__dq_head);
      return;
    }
  }
  lace_abort_stack_overflow();
}

Assistant:

VOID_TASK_0(lddmc_refs_mark_task)
{
    LOCALIZE_THREAD_LOCAL(lddmc_refs_key, lddmc_refs_internal_t);
    SPAWN(lddmc_refs_mark_p_par, lddmc_refs_key->pbegin, lddmc_refs_key->pcur-lddmc_refs_key->pbegin);
    SPAWN(lddmc_refs_mark_r_par, lddmc_refs_key->rbegin, lddmc_refs_key->rcur-lddmc_refs_key->rbegin);
    CALL(lddmc_refs_mark_s_par, lddmc_refs_key->sbegin, lddmc_refs_key->scur-lddmc_refs_key->sbegin);
    SYNC(lddmc_refs_mark_r_par);
    SYNC(lddmc_refs_mark_p_par);
}